

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thumb_instr.c
# Opt level: O2

thumb_instr_type_t get_thumb_instr_type_hash(uint16_t hash)

{
  thumb_instr_type_t tVar1;
  thumb_instr_type_t tVar2;
  thumb_instr_type_t tVar3;
  
  tVar3 = (thumb_instr_type_t)hash;
  tVar2 = tVar3 & 0x3e0;
  if (tVar2 == 0x60) {
    tVar2 = ADD_SUBTRACT;
  }
  else {
    tVar1 = tVar3 & 0x380;
    if ((hash & 0x380) == 0) {
      return tVar1;
    }
    if (tVar1 == 0x80) {
      tVar2 = IMMEDIATE_OPERATIONS;
    }
    else if ((tVar3 & 0x3f0) == 0x100) {
      tVar2 = ALU_OPERATIONS;
    }
    else if ((tVar3 & 0x3f0) == 0x110) {
      if ((hash & 0xc) == 0xc || (hash & 3) != 0) {
        tVar2 = THUMB_UNDEFINED;
        if ((hash & 2) == 0) {
          tVar2 = HIGH_REGISTER_OPERATIONS;
        }
        if ((hash & 0xc) != 0xc) {
          tVar2 = HIGH_REGISTER_OPERATIONS;
        }
        return tVar2;
      }
      tVar2 = THUMB_UNDEFINED;
    }
    else if (tVar2 == 0x120) {
      tVar2 = PC_RELATIVE_LOAD;
    }
    else if ((tVar3 & 0x3c8) == 0x140) {
      tVar2 = LOAD_STORE_RO;
    }
    else if ((tVar3 & 0x3c8) == 0x148) {
      tVar2 = LOAD_STORE_BYTE_HALFWORD;
    }
    else if (tVar1 == 0x180) {
      tVar2 = LOAD_STORE_IO;
    }
    else {
      tVar1 = tVar3 & 0x3c0;
      if (tVar1 == 0x200) {
        tVar2 = LOAD_STORE_HALFWORD;
      }
      else if (tVar1 == 0x280) {
        tVar2 = LOAD_ADDRESS;
      }
      else if (tVar1 == 0x240) {
        tVar2 = SP_RELATIVE_LOAD_STORE;
      }
      else if ((tVar3 & 0x3fc) == 0x2c0) {
        tVar2 = ADD_OFFSET_TO_STACK_POINTER;
      }
      else if ((tVar3 & 0x3d8) == 0x2d0) {
        tVar2 = PUSH_POP_REGISTERS;
      }
      else if (tVar1 == 0x300) {
        tVar2 = MULTIPLE_LOAD_STORE;
      }
      else if ((tVar3 & 0x3fc) == 0x37c) {
        tVar2 = THUMB_SOFTWARE_INTERRUPT;
      }
      else {
        if (tVar1 == 0x340) {
          return (uint)((~tVar3 & 0x38) == 0) * 4 + CONDITIONAL_BRANCH;
        }
        if (tVar2 != 0x380) {
          return tVar1 == 0x3c0 ^ THUMB_UNDEFINED;
        }
        tVar2 = UNCONDITIONAL_BRANCH;
      }
    }
  }
  return tVar2;
}

Assistant:

thumb_instr_type_t get_thumb_instr_type_hash(half hash) {
    if ((hash & 0b1111100000u) == 0b0001100000u) {
        return ADD_SUBTRACT;
    }
    if ((hash & 0b1110000000u) == 0b0000000000u) {
        return MOVE_SHIFTED_REGISTER;
    }
    if ((hash & 0b1110000000u) == 0b0010000000u) {
        return IMMEDIATE_OPERATIONS;
    }
    if ((hash & 0b1111110000u) == 0b0100000000u) {
        return ALU_OPERATIONS;
    }
    if ((hash & 0b1111110000u) == 0b0100010000u) {
        bool h1 = (hash >> 1u) & 1u;
        bool h2 = hash & 1u;
        byte opcode = (hash >> 2u) & 0b11u;

        if (opcode != 0b11 && h1 == 0 && h2 == 0) return THUMB_UNDEFINED;
        if (opcode == 0b11 && h1 == 1) return THUMB_UNDEFINED;

        return HIGH_REGISTER_OPERATIONS;
    }
    if ((hash & 0b1111100000u) == 0b0100100000u) return PC_RELATIVE_LOAD;
    if ((hash & 0b1111001000u) == 0b0101000000u) return LOAD_STORE_RO;
    if ((hash & 0b1111001000u) == 0b0101001000u) return LOAD_STORE_BYTE_HALFWORD;
    if ((hash & 0b1110000000u) == 0b0110000000u) return LOAD_STORE_IO;
    if ((hash & 0b1111000000u) == 0b1000000000u) return LOAD_STORE_HALFWORD;
    if ((hash & 0b1111000000u) == 0b1001000000u) return SP_RELATIVE_LOAD_STORE;
    if ((hash & 0b1111000000u) == 0b1010000000u) return LOAD_ADDRESS;
    if ((hash & 0b1111111100u) == 0b1011000000u) return ADD_OFFSET_TO_STACK_POINTER;
    if ((hash & 0b1111011000u) == 0b1011010000u) return PUSH_POP_REGISTERS;
    if ((hash & 0b1111000000u) == 0b1100000000u) return MULTIPLE_LOAD_STORE;
    if ((hash & 0b1111111100u) == 0b1101111100u) return THUMB_SOFTWARE_INTERRUPT;
    if ((hash & 0b1111000000u) == 0b1101000000u) {
        if (((hash >> 3u) & 0b111u) == 0b111u) {
            return THUMB_UNDEFINED;
        }

        return CONDITIONAL_BRANCH;
    }
    if ((hash & 0b1111100000u) == 0b1110000000u) return UNCONDITIONAL_BRANCH;
    if ((hash & 0b1111000000u) == 0b1111000000u) return LONG_BRANCH_LINK;

    return THUMB_UNDEFINED;
}